

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ptls_iovec_t ikm;
  int iVar4;
  ptls_key_schedule_t *ppVar5;
  long lVar6;
  ulong uVar7;
  ptls_iovec_t *ppVar8;
  en_ptls_state_t eVar9;
  byte local_4d9;
  size_t psk_binder_off;
  size_t body_size;
  size_t body_size_4;
  size_t body_size_25;
  size_t body_size_28;
  size_t body_size_29;
  size_t body_start_29;
  size_t capacity_29;
  size_t body_start_28;
  size_t capacity_28;
  size_t body_size_26;
  ulong uStack_478;
  uint32_t _v_18;
  size_t body_size_27;
  size_t body_start_27;
  size_t capacity_27;
  size_t body_start_26;
  size_t capacity_26;
  size_t body_start_25;
  size_t capacity_25;
  ulong uStack_438;
  uint16_t _v_17;
  size_t body_size_24;
  size_t body_start_24;
  size_t capacity_24;
  ulong uStack_418;
  uint16_t _v_16;
  size_t body_size_22;
  size_t body_size_23;
  size_t local_400;
  size_t body_start_23;
  size_t capacity_23;
  size_t body_start_22;
  size_t capacity_22;
  ulong uStack_3d8;
  uint16_t _v_15;
  size_t body_size_20;
  size_t body_size_21;
  size_t body_start_21;
  size_t capacity_21;
  size_t body_start_20;
  size_t capacity_20;
  ulong uStack_3a0;
  uint16_t _v_14;
  size_t body_size_18;
  size_t body_size_19;
  size_t sStack_388;
  uint16_t _v_13;
  size_t body_start_19;
  size_t capacity_19;
  ptls_key_exchange_algorithm_t **algo_1;
  size_t body_start_18;
  size_t capacity_18;
  ulong uStack_358;
  uint16_t _v_12;
  size_t body_size_17;
  size_t body_start_17;
  size_t capacity_17;
  ulong uStack_338;
  uint16_t _v_11;
  size_t body_size_15;
  size_t body_size_16;
  long lStack_320;
  uint16_t _v_10;
  size_t i_1;
  size_t body_start_16;
  size_t capacity_16;
  size_t body_start_15;
  size_t capacity_15;
  ulong uStack_2f0;
  uint16_t _v_9;
  size_t body_size_13;
  size_t body_size_14;
  uint16_t *puStack_2d8;
  uint16_t _v_8;
  uint16_t *algo;
  size_t body_start_14;
  size_t capacity_14;
  size_t body_start_13;
  size_t capacity_13;
  ulong uStack_2a8;
  uint16_t _v_7;
  size_t body_size_10;
  size_t body_size_11;
  size_t body_size_12;
  ptls_iovec_t p;
  size_t body_start_12;
  size_t capacity_12;
  size_t i;
  size_t body_start_11;
  size_t capacity_11;
  size_t body_start_10;
  size_t capacity_10;
  ulong uStack_240;
  uint16_t _v_6;
  size_t body_size_9;
  size_t body_start_9;
  size_t capacity_9;
  ulong uStack_220;
  uint16_t _v_5;
  size_t body_size_8;
  size_t body_start_8;
  size_t capacity_8;
  ulong uStack_200;
  uint16_t _v_4;
  size_t body_size_7;
  size_t body_start_7;
  size_t capacity_7;
  ulong uStack_1e0;
  uint16_t _v_3;
  size_t body_size_5;
  size_t body_size_6;
  size_t body_start_6;
  size_t capacity_6;
  size_t body_start_5;
  size_t capacity_5;
  size_t sStack_1a8;
  uint16_t _v_2;
  anon_struct_16_2_441dca6f key_share_client_hello;
  size_t body_start_4;
  size_t capacity_4;
  size_t body_size_3;
  size_t local_178;
  size_t body_start_3;
  size_t capacity_3;
  size_t body_size_2;
  ptls_cipher_suite_t **pppStack_158;
  uint16_t _v_1;
  ptls_cipher_suite_t **cs;
  size_t body_start_2;
  size_t capacity_2;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  ptls_buffer_t *ppStack_120;
  uint16_t _v;
  ptls_buffer_t *sendbuf;
  size_t body_start;
  size_t capacity;
  size_t local_100;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  uint8_t *local_d8;
  uint local_cc;
  ptls_cipher_suite_t *ppStack_c8;
  uint32_t max_early_data_size;
  ptls_cipher_suite_t *cipher_suite;
  ptls_key_exchange_algorithm_t *key_share;
  uint local_b0;
  int send_sni;
  int is_second_flight;
  int ret;
  uint8_t binder_key [64];
  long local_60;
  size_t msghash_off;
  char *pcStack_50;
  uint32_t obfuscated_ticket_age;
  char *published_sni;
  ptls_iovec_t resumption_ticket;
  ptls_iovec_t resumption_secret;
  ptls_iovec_t *cookie_local;
  ptls_handshake_properties_t *properties_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  
  memset(&resumption_ticket.len,0,0x10);
  pcStack_50 = (char *)0x0;
  msghash_off._4_4_ = 0;
  local_b0 = (uint)(tls->key_schedule != (ptls_key_schedule_t *)0x0);
  local_4d9 = 0;
  if (tls->server_name != (char *)0x0) {
    iVar4 = ptls_server_name_is_ipaddr(tls->server_name);
    local_4d9 = iVar4 != 0 ^ 0xff;
  }
  key_share._4_4_ = (uint)(local_4d9 & 1);
  if (properties != (ptls_handshake_properties_t *)0x0) {
    if (((local_b0 == 0) && (key_share._4_4_ != 0)) &&
       ((properties->field_0).client.esni_keys.base != (uint8_t *)0x0)) {
      send_sni = client_setup_esni(tls->ctx,&tls->esni,(properties->field_0).client.esni_keys,
                                   &stack0xffffffffffffffb0,tls->client_random);
      if ((send_sni != 0) ||
         ((tls->ctx->update_esni_key != (ptls_update_esni_key_t *)0x0 &&
          (send_sni = (*tls->ctx->update_esni_key->cb)
                                (tls->ctx->update_esni_key,tls,tls->esni->secret,
                                 ((tls->esni->client).cipher)->hash,tls->esni->esni_contents_hash),
          send_sni != 0)))) goto LAB_0011718a;
      send_sni = 0;
    }
    if ((properties->field_0).client.session_ticket.base != (uint8_t *)0x0) {
      cipher_suite = (ptls_cipher_suite_t *)0x0;
      ppStack_c8 = (ptls_cipher_suite_t *)0x0;
      iVar4 = decode_stored_session_ticket
                        (tls,(ptls_key_exchange_algorithm_t **)&cipher_suite,
                         &stack0xffffffffffffff38,(ptls_iovec_t *)&resumption_ticket.len,
                         (uint32_t *)((long)&msghash_off + 4),(ptls_iovec_t *)&published_sni,
                         &local_cc,(properties->field_0).client.session_ticket.base,
                         (properties->field_0).client.session_ticket.base +
                         (properties->field_0).client.session_ticket.len);
      if (iVar4 == 0) {
        (tls->field_18).server.pending_traffic_secret[0x38] =
             (tls->field_18).server.pending_traffic_secret[0x38] & 0xfe | 1;
        if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
          tls->key_share = (ptls_key_exchange_algorithm_t *)cipher_suite;
        }
        tls->cipher_suite = ppStack_c8;
        if (((local_b0 == 0) && (local_cc != 0)) &&
           ((properties->field_0).client.max_early_data_size != (size_t *)0x0)) {
          (tls->field_18).server.pending_traffic_secret[0x38] =
               (tls->field_18).server.pending_traffic_secret[0x38] & 0xfd | 2;
          *(properties->field_0).client.max_early_data_size = (ulong)local_cc;
        }
      }
      else {
        __emitter = ptls_iovec_init((void *)0x0,0);
        resumption_ticket.len = (size_t)_emitter;
        resumption_secret.base = local_d8;
      }
    }
    if (((tls->field_18).server.pending_traffic_secret[0x38] >> 1 & 1) == 0) {
      if ((properties->field_0).client.max_early_data_size != (size_t *)0x0) {
        *(properties->field_0).client.max_early_data_size = 0;
      }
      (properties->field_0).client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
    }
    else {
      (properties->field_0).client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
    }
  }
  if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) &&
     ((properties == (ptls_handshake_properties_t *)0x0 ||
      (((properties->field_0).server.selected_psk_binder.base[0x2c] & 1) == 0)))) {
    tls->key_share = *tls->ctx->key_exchanges;
  }
  if (local_b0 == 0) {
    ppVar5 = key_schedule_new(tls->cipher_suite,tls->ctx->cipher_suites,
                              tls->ctx->hkdf_label_prefix__obsolete);
    tls->key_schedule = ppVar5;
    ikm.len = (size_t)resumption_secret.base;
    ikm.base = (uint8_t *)resumption_ticket.len;
    send_sni = key_schedule_extract(tls->key_schedule,ikm);
    if (send_sni != 0) goto LAB_0011718a;
    send_sni = 0;
  }
  lVar6 = emitter->buf->off + emitter->record_header_length;
  _buf = (ptls_buffer_t *)emitter;
  send_sni = (*emitter->begin_message)(emitter);
  if (send_sni != 0) goto LAB_0011718a;
  _key_sched = (ptls_key_schedule_t *)_buf->base;
  mess_start = 0;
  local_100 = *(size_t *)_key_sched->secret;
  capacity._7_1_ = 1;
  send_sni = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,(void *)((long)&capacity + 7),1);
  if (send_sni != 0) goto LAB_0011718a;
  body_start = 3;
  send_sni = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,"",3);
  if (send_sni != 0) goto LAB_0011718a;
  sendbuf = *(ptls_buffer_t **)_key_sched->secret;
  ppStack_120 = emitter->buf;
  capacity_1._6_2_ = 0x303;
  capacity_1._4_1_ = 3;
  capacity_1._5_1_ = 3;
  send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)((long)&capacity_1 + 4),2);
  if ((send_sni != 0) ||
     (send_sni = ptls_buffer__do_pushv(ppStack_120,tls->client_random,0x20), send_sni != 0))
  goto LAB_0011718a;
  body_start_1 = 1;
  send_sni = ptls_buffer__do_pushv(ppStack_120,"",1);
  if (send_sni != 0) goto LAB_0011718a;
  body_size_1 = ppStack_120->off;
  send_sni = ptls_buffer__do_pushv
                       (ppStack_120,(tls->field_18).client.legacy_session_id.base,
                        (tls->field_18).client.legacy_session_id.len);
  if (send_sni != 0) goto LAB_0011718a;
  capacity_2 = ppStack_120->off - body_size_1;
  if (body_start_1 == 0xffffffffffffffff) {
    send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,capacity_2);
    if (send_sni != 0) goto LAB_0011718a;
  }
  else {
    for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
      ppStack_120->base[body_size_1 - body_start_1] =
           (uint8_t)(capacity_2 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
    }
  }
  send_sni = 0;
  body_start_2 = 2;
  send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
  if (send_sni != 0) goto LAB_0011718a;
  cs = (ptls_cipher_suite_t **)ppStack_120->off;
  for (pppStack_158 = tls->ctx->cipher_suites; send_sni = 0,
      *pppStack_158 != (ptls_cipher_suite_t *)0x0; pppStack_158 = pppStack_158 + 1) {
    body_size_2._6_2_ = (*pppStack_158)->id;
    body_size_2._4_1_ = (undefined1)(body_size_2._6_2_ >> 8);
    body_size_2._5_1_ = (undefined1)body_size_2._6_2_;
    send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)((long)&body_size_2 + 4),2);
    if (send_sni != 0) goto LAB_0011718a;
  }
  capacity_3 = ppStack_120->off - (long)cs;
  if (body_start_2 == 0xffffffffffffffff) {
    send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,capacity_3);
    if (send_sni != 0) goto LAB_0011718a;
  }
  else {
    for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
      *(char *)((long)cs + ((long)ppStack_120->base - body_start_2)) =
           (char)(capacity_3 >> (((char)body_start_2 + -1) * '\b' & 0x3fU));
    }
  }
  send_sni = 0;
  body_start_3 = 1;
  send_sni = ptls_buffer__do_pushv(ppStack_120,"",1);
  if (send_sni != 0) goto LAB_0011718a;
  local_178 = ppStack_120->off;
  body_size_3._7_1_ = 0;
  send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)((long)&body_size_3 + 7),1);
  if (send_sni != 0) goto LAB_0011718a;
  uVar7 = ppStack_120->off - local_178;
  if (body_start_3 == 0xffffffffffffffff) {
    send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uVar7);
    if (send_sni != 0) goto LAB_0011718a;
  }
  else {
    for (; body_start_3 != 0; body_start_3 = body_start_3 - 1) {
      ppStack_120->base[local_178 - body_start_3] =
           (uint8_t)(uVar7 >> (((char)body_start_3 + -1) * '\b' & 0x3fU));
    }
  }
  send_sni = 0;
  body_start_4 = 2;
  send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
  if (send_sni != 0) goto LAB_0011718a;
  key_share_client_hello.len = ppStack_120->off;
  capacity_5._6_2_ = 0x33;
  capacity_5._4_1_ = 0;
  capacity_5._5_1_ = 0x33;
  send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)((long)&capacity_5 + 4),2);
  if (send_sni != 0) goto LAB_0011718a;
  body_start_5 = 2;
  send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
  if (send_sni != 0) goto LAB_0011718a;
  capacity_6 = ppStack_120->off;
  sStack_1a8 = ppStack_120->off;
  body_start_6 = 2;
  send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
  if ((send_sni != 0) ||
     ((body_size_6 = ppStack_120->off, tls->key_share != (ptls_key_exchange_algorithm_t *)0x0 &&
      ((send_sni = (*tls->key_share->create)(tls->key_share,&(tls->field_18).client.key_share_ctx),
       send_sni != 0 ||
       (send_sni = push_key_share_entry
                             (ppStack_120,tls->key_share->id,
                              ((tls->field_18).client.key_share_ctx)->pubkey), send_sni != 0))))))
  goto LAB_0011718a;
  send_sni = 0;
  body_size_5 = ppStack_120->off - body_size_6;
  if (body_start_6 == 0xffffffffffffffff) {
    send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,body_size_5);
    if (send_sni != 0) goto LAB_0011718a;
  }
  else {
    for (; body_start_6 != 0; body_start_6 = body_start_6 - 1) {
      ppStack_120->base[body_size_6 - body_start_6] =
           (uint8_t)(body_size_5 >> (((char)body_start_6 + -1) * '\b' & 0x3fU));
    }
  }
  send_sni = 0;
  key_share_client_hello.off = ppStack_120->off - sStack_1a8;
  uStack_1e0 = ppStack_120->off - capacity_6;
  if (body_start_5 == 0xffffffffffffffff) {
    send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uStack_1e0);
    if (send_sni != 0) goto LAB_0011718a;
  }
  else {
    for (; body_start_5 != 0; body_start_5 = body_start_5 - 1) {
      ppStack_120->base[capacity_6 - body_start_5] =
           (uint8_t)(uStack_1e0 >> (((char)body_start_5 + -1) * '\b' & 0x3fU));
    }
  }
  send_sni = 0;
  if (key_share._4_4_ != 0) {
    if (tls->esni == (ptls_esni_secret_t *)0x0) {
      capacity_9._6_2_ = 0;
      capacity_9._4_1_ = 0;
      capacity_9._5_1_ = 0;
      send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)((long)&capacity_9 + 4),2);
      if (send_sni != 0) goto LAB_0011718a;
      body_start_9 = 2;
      send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
      if (send_sni != 0) goto LAB_0011718a;
      body_size_9 = ppStack_120->off;
      send_sni = emit_server_name_extension(ppStack_120,tls->server_name);
      if (send_sni != 0) goto LAB_0011718a;
      uStack_240 = ppStack_120->off - body_size_9;
      if (body_start_9 == 0xffffffffffffffff) {
        send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uStack_240);
        goto joined_r0x00114f12;
      }
      for (; body_start_9 != 0; body_start_9 = body_start_9 - 1) {
        ppStack_120->base[body_size_9 - body_start_9] =
             (uint8_t)(uStack_240 >> (((char)body_start_9 + -1) * '\b' & 0x3fU));
      }
    }
    else {
      if (pcStack_50 != (char *)0x0) {
        capacity_7._6_2_ = 0;
        capacity_7._4_1_ = 0;
        capacity_7._5_1_ = 0;
        send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)((long)&capacity_7 + 4),2);
        if (send_sni != 0) goto LAB_0011718a;
        body_start_7 = 2;
        send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
        if (send_sni != 0) goto LAB_0011718a;
        body_size_7 = ppStack_120->off;
        send_sni = emit_server_name_extension(ppStack_120,pcStack_50);
        if (send_sni != 0) goto LAB_0011718a;
        uStack_200 = ppStack_120->off - body_size_7;
        if (body_start_7 == 0xffffffffffffffff) {
          send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uStack_200);
          if (send_sni != 0) goto LAB_0011718a;
        }
        else {
          for (; body_start_7 != 0; body_start_7 = body_start_7 - 1) {
            ppStack_120->base[body_size_7 - body_start_7] =
                 (uint8_t)(uStack_200 >> (((char)body_start_7 + -1) * '\b' & 0x3fU));
          }
        }
      }
      send_sni = 0;
      capacity_8._6_2_ = 0xffce;
      capacity_8._4_1_ = 0xff;
      capacity_8._5_1_ = 0xce;
      send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)((long)&capacity_8 + 4),2);
      if (send_sni != 0) goto LAB_0011718a;
      body_start_8 = 2;
      send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
      if (send_sni != 0) goto LAB_0011718a;
      body_size_8 = ppStack_120->off;
      send_sni = emit_esni_extension(tls->esni,ppStack_120,(properties->field_0).client.esni_keys,
                                     tls->server_name,sStack_1a8,key_share_client_hello.off);
      if (send_sni != 0) goto LAB_0011718a;
      uStack_220 = ppStack_120->off - body_size_8;
      if (body_start_8 == 0xffffffffffffffff) {
        send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uStack_220);
joined_r0x00114f12:
        if (send_sni != 0) goto LAB_0011718a;
      }
      else {
        for (; body_start_8 != 0; body_start_8 = body_start_8 - 1) {
          ppStack_120->base[body_size_8 - body_start_8] =
               (uint8_t)(uStack_220 >> (((char)body_start_8 + -1) * '\b' & 0x3fU));
        }
      }
    }
  }
  send_sni = 0;
  if ((properties != (ptls_handshake_properties_t *)0x0) &&
     ((properties->field_0).client.negotiated_protocols.count != 0)) {
    capacity_10._6_2_ = 0x10;
    capacity_10._4_1_ = 0;
    capacity_10._5_1_ = 0x10;
    send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)((long)&capacity_10 + 4),2);
    if (send_sni != 0) goto LAB_0011718a;
    body_start_10 = 2;
    send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
    if (send_sni != 0) goto LAB_0011718a;
    sVar1 = ppStack_120->off;
    body_start_11 = 2;
    send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
    if (send_sni != 0) goto LAB_0011718a;
    sVar2 = ppStack_120->off;
    for (capacity_12 = 0; send_sni = 0,
        capacity_12 != (properties->field_0).client.negotiated_protocols.count;
        capacity_12 = capacity_12 + 1) {
      body_start_12 = 1;
      send_sni = ptls_buffer__do_pushv(ppStack_120,"",1);
      if (send_sni != 0) goto LAB_0011718a;
      p.len = ppStack_120->off;
      ppVar8 = (properties->field_0).client.negotiated_protocols.list + capacity_12;
      body_size_12 = (size_t)ppVar8->base;
      p.base = (uint8_t *)ppVar8->len;
      send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)body_size_12,(size_t)p.base);
      if (send_sni != 0) goto LAB_0011718a;
      body_size_11 = ppStack_120->off - p.len;
      for (; body_start_12 != 0; body_start_12 = body_start_12 - 1) {
        ppStack_120->base[p.len - body_start_12] =
             (uint8_t)(body_size_11 >> (((char)body_start_12 + -1) * '\b' & 0x3fU));
      }
    }
    body_size_10 = ppStack_120->off - sVar2;
    for (; body_start_11 != 0; body_start_11 = body_start_11 - 1) {
      ppStack_120->base[sVar2 - body_start_11] =
           (uint8_t)(body_size_10 >> (((char)body_start_11 + -1) * '\b' & 0x3fU));
    }
    uStack_2a8 = ppStack_120->off - sVar1;
    for (; body_start_10 != 0; body_start_10 = body_start_10 - 1) {
      ppStack_120->base[sVar1 - body_start_10] =
           (uint8_t)(uStack_2a8 >> (((char)body_start_10 + -1) * '\b' & 0x3fU));
    }
  }
  send_sni = 0;
  if (tls->ctx->decompress_certificate != (ptls_decompress_certificate_t *)0x0) {
    capacity_13._6_2_ = 0x1b;
    capacity_13._4_1_ = 0;
    capacity_13._5_1_ = 0x1b;
    send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)((long)&capacity_13 + 4),2);
    if (send_sni != 0) goto LAB_0011718a;
    body_start_13 = 2;
    send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
    if (send_sni != 0) goto LAB_0011718a;
    capacity_14 = ppStack_120->off;
    body_start_14 = 1;
    send_sni = ptls_buffer__do_pushv(ppStack_120,"",1);
    if (send_sni != 0) goto LAB_0011718a;
    algo = (uint16_t *)ppStack_120->off;
    puStack_2d8 = tls->ctx->decompress_certificate->supported_algorithms;
    if (*puStack_2d8 == 0xffff) {
      __assert_fail("*algo != UINT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                    ,0x7f4,
                    "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                   );
    }
    for (; send_sni = 0, *puStack_2d8 != 0xffff; puStack_2d8 = puStack_2d8 + 1) {
      body_size_14._6_2_ = *puStack_2d8;
      body_size_14._4_1_ = (undefined1)(body_size_14._6_2_ >> 8);
      body_size_14._5_1_ = (undefined1)body_size_14._6_2_;
      send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)((long)&body_size_14 + 4),2);
      if (send_sni != 0) goto LAB_0011718a;
    }
    body_size_13 = ppStack_120->off - (long)algo;
    if (body_start_14 == 0xffffffffffffffff) {
      send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,body_size_13);
      if (send_sni != 0) goto LAB_0011718a;
    }
    else {
      for (; body_start_14 != 0; body_start_14 = body_start_14 - 1) {
        *(char *)((long)algo + ((long)ppStack_120->base - body_start_14)) =
             (char)(body_size_13 >> (((char)body_start_14 + -1) * '\b' & 0x3fU));
      }
    }
    send_sni = 0;
    uStack_2f0 = ppStack_120->off - capacity_14;
    if (body_start_13 == 0xffffffffffffffff) {
      send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uStack_2f0);
      if (send_sni != 0) goto LAB_0011718a;
    }
    else {
      for (; body_start_13 != 0; body_start_13 = body_start_13 - 1) {
        ppStack_120->base[capacity_14 - body_start_13] =
             (uint8_t)(uStack_2f0 >> (((char)body_start_13 + -1) * '\b' & 0x3fU));
      }
    }
  }
  send_sni = 0;
  capacity_15._6_2_ = 0x2b;
  capacity_15._4_1_ = 0;
  capacity_15._5_1_ = 0x2b;
  send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)((long)&capacity_15 + 4),2);
  if (send_sni == 0) {
    body_start_15 = 2;
    send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
    if (send_sni == 0) {
      capacity_16 = ppStack_120->off;
      body_start_16 = 1;
      send_sni = ptls_buffer__do_pushv(ppStack_120,"",1);
      if (send_sni == 0) {
        i_1 = ppStack_120->off;
        for (lStack_320 = 0; send_sni = 0, lStack_320 != 4; lStack_320 = lStack_320 + 1) {
          body_size_16._6_2_ = supported_versions[lStack_320];
          body_size_16._4_1_ = (undefined1)(body_size_16._6_2_ >> 8);
          body_size_16._5_1_ = (undefined1)body_size_16._6_2_;
          send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)((long)&body_size_16 + 4),2);
          if (send_sni != 0) goto LAB_0011718a;
        }
        body_size_15 = ppStack_120->off - i_1;
        if (body_start_16 == 0xffffffffffffffff) {
          send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,body_size_15);
          if (send_sni != 0) goto LAB_0011718a;
        }
        else {
          for (; body_start_16 != 0; body_start_16 = body_start_16 - 1) {
            ppStack_120->base[i_1 - body_start_16] =
                 (uint8_t)(body_size_15 >> (((char)body_start_16 + -1) * '\b' & 0x3fU));
          }
        }
        send_sni = 0;
        uStack_338 = ppStack_120->off - capacity_16;
        if (body_start_15 == 0xffffffffffffffff) {
          send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uStack_338);
          if (send_sni != 0) goto LAB_0011718a;
        }
        else {
          for (; body_start_15 != 0; body_start_15 = body_start_15 - 1) {
            ppStack_120->base[capacity_16 - body_start_15] =
                 (uint8_t)(uStack_338 >> (((char)body_start_15 + -1) * '\b' & 0x3fU));
          }
        }
        send_sni = 0;
        capacity_17._6_2_ = 0xd;
        capacity_17._4_1_ = 0;
        capacity_17._5_1_ = 0xd;
        send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)((long)&capacity_17 + 4),2);
        if (send_sni == 0) {
          body_start_17 = 2;
          send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
          if (send_sni == 0) {
            body_size_17 = ppStack_120->off;
            send_sni = push_signature_algorithms(ppStack_120);
            if (send_sni == 0) {
              uStack_358 = ppStack_120->off - body_size_17;
              if (body_start_17 == 0xffffffffffffffff) {
                send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uStack_358);
                if (send_sni != 0) goto LAB_0011718a;
              }
              else {
                for (; body_start_17 != 0; body_start_17 = body_start_17 - 1) {
                  ppStack_120->base[body_size_17 - body_start_17] =
                       (uint8_t)(uStack_358 >> (((char)body_start_17 + -1) * '\b' & 0x3fU));
                }
              }
              send_sni = 0;
              capacity_18._6_2_ = 10;
              capacity_18._4_1_ = 0;
              capacity_18._5_1_ = 10;
              send_sni = ptls_buffer__do_pushv(ppStack_120,(void *)((long)&capacity_18 + 4),2);
              if (send_sni == 0) {
                body_start_18 = 2;
                send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
                if (send_sni == 0) {
                  algo_1 = (ptls_key_exchange_algorithm_t **)ppStack_120->off;
                  capacity_19 = (size_t)tls->ctx->key_exchanges;
                  body_start_19 = 2;
                  send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
                  if (send_sni == 0) {
                    sStack_388 = ppStack_120->off;
                    for (; send_sni = 0, *(long *)capacity_19 != 0; capacity_19 = capacity_19 + 8) {
                      body_size_19._6_2_ = **(undefined2 **)capacity_19;
                      body_size_19._4_1_ = (undefined1)((ushort)body_size_19._6_2_ >> 8);
                      body_size_19._5_1_ = (undefined1)body_size_19._6_2_;
                      send_sni = ptls_buffer__do_pushv
                                           (ppStack_120,(void *)((long)&body_size_19 + 4),2);
                      if (send_sni != 0) goto LAB_0011718a;
                    }
                    body_size_18 = ppStack_120->off - sStack_388;
                    if (body_start_19 == 0xffffffffffffffff) {
                      send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,body_size_18);
                      if (send_sni != 0) goto LAB_0011718a;
                    }
                    else {
                      for (; body_start_19 != 0; body_start_19 = body_start_19 - 1) {
                        ppStack_120->base[sStack_388 - body_start_19] =
                             (uint8_t)(body_size_18 >> (((char)body_start_19 + -1) * '\b' & 0x3fU));
                      }
                    }
                    send_sni = 0;
                    uStack_3a0 = ppStack_120->off - (long)algo_1;
                    if (body_start_18 == 0xffffffffffffffff) {
                      send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uStack_3a0);
                      if (send_sni != 0) goto LAB_0011718a;
                    }
                    else {
                      for (; body_start_18 != 0; body_start_18 = body_start_18 - 1) {
                        *(char *)((long)algo_1 + ((long)ppStack_120->base - body_start_18)) =
                             (char)(uStack_3a0 >> (((char)body_start_18 + -1) * '\b' & 0x3fU));
                      }
                    }
                    send_sni = 0;
                    if ((cookie != (ptls_iovec_t *)0x0) && (cookie->base != (uint8_t *)0x0)) {
                      capacity_20._6_2_ = 0x2c;
                      capacity_20._4_1_ = 0;
                      capacity_20._5_1_ = 0x2c;
                      send_sni = ptls_buffer__do_pushv
                                           (ppStack_120,(void *)((long)&capacity_20 + 4),2);
                      if (send_sni != 0) goto LAB_0011718a;
                      body_start_20 = 2;
                      send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
                      if (send_sni != 0) goto LAB_0011718a;
                      capacity_21 = ppStack_120->off;
                      body_start_21 = 2;
                      send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
                      if (send_sni != 0) goto LAB_0011718a;
                      body_size_21 = ppStack_120->off;
                      send_sni = ptls_buffer__do_pushv(ppStack_120,cookie->base,cookie->len);
                      if (send_sni != 0) goto LAB_0011718a;
                      body_size_20 = ppStack_120->off - body_size_21;
                      if (body_start_21 == 0xffffffffffffffff) {
                        send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,body_size_20);
                        if (send_sni != 0) goto LAB_0011718a;
                      }
                      else {
                        for (; body_start_21 != 0; body_start_21 = body_start_21 - 1) {
                          ppStack_120->base[body_size_21 - body_start_21] =
                               (uint8_t)(body_size_20 >> (((char)body_start_21 + -1) * '\b' & 0x3fU)
                                        );
                        }
                      }
                      send_sni = 0;
                      uStack_3d8 = ppStack_120->off - capacity_21;
                      if (body_start_20 == 0xffffffffffffffff) {
                        send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uStack_3d8);
                        if (send_sni != 0) goto LAB_0011718a;
                      }
                      else {
                        for (; body_start_20 != 0; body_start_20 = body_start_20 - 1) {
                          ppStack_120->base[capacity_21 - body_start_20] =
                               (uint8_t)(uStack_3d8 >> (((char)body_start_20 + -1) * '\b' & 0x3fU));
                        }
                      }
                    }
                    send_sni = 0;
                    send_sni = push_additional_extensions(properties,ppStack_120);
                    if (send_sni == 0) {
                      if ((tls->ctx->save_ticket != (ptls_save_ticket_t *)0x0) ||
                         (resumption_ticket.len != 0)) {
                        capacity_22._6_2_ = 0x2d;
                        capacity_22._4_1_ = 0;
                        capacity_22._5_1_ = 0x2d;
                        send_sni = ptls_buffer__do_pushv
                                             (ppStack_120,(void *)((long)&capacity_22 + 4),2);
                        if (send_sni != 0) goto LAB_0011718a;
                        body_start_22 = 2;
                        send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
                        if (send_sni != 0) goto LAB_0011718a;
                        capacity_23 = ppStack_120->off;
                        body_start_23 = 1;
                        send_sni = ptls_buffer__do_pushv(ppStack_120,"",1);
                        if (send_sni != 0) goto LAB_0011718a;
                        local_400 = ppStack_120->off;
                        if ((tls->ctx->field_0x70 & 1) == 0) {
                          body_size_23._7_1_ = 0;
                          send_sni = ptls_buffer__do_pushv
                                               (ppStack_120,(void *)((long)&body_size_23 + 7),1);
                          if (send_sni != 0) goto LAB_0011718a;
                        }
                        send_sni = 0;
                        body_size_23._6_1_ = 1;
                        send_sni = ptls_buffer__do_pushv
                                             (ppStack_120,(void *)((long)&body_size_23 + 6),1);
                        if (send_sni != 0) goto LAB_0011718a;
                        body_size_22 = ppStack_120->off - local_400;
                        if (body_start_23 == 0xffffffffffffffff) {
                          send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,body_size_22);
                          if (send_sni != 0) goto LAB_0011718a;
                        }
                        else {
                          for (; body_start_23 != 0; body_start_23 = body_start_23 - 1) {
                            ppStack_120->base[local_400 - body_start_23] =
                                 (uint8_t)(body_size_22 >>
                                          (((char)body_start_23 + -1) * '\b' & 0x3fU));
                          }
                        }
                        send_sni = 0;
                        uStack_418 = ppStack_120->off - capacity_23;
                        if (body_start_22 == 0xffffffffffffffff) {
                          send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uStack_418);
                          if (send_sni != 0) goto LAB_0011718a;
                        }
                        else {
                          for (; body_start_22 != 0; body_start_22 = body_start_22 - 1) {
                            ppStack_120->base[capacity_23 - body_start_22] =
                                 (uint8_t)(uStack_418 >> (((char)body_start_22 + -1) * '\b' & 0x3fU)
                                          );
                          }
                        }
                      }
                      send_sni = 0;
                      if (resumption_ticket.len != 0) {
                        if ((((tls->field_18).server.pending_traffic_secret[0x38] >> 1 & 1) != 0) &&
                           (local_b0 == 0)) {
                          capacity_24._6_2_ = 0x2a;
                          capacity_24._4_1_ = 0;
                          capacity_24._5_1_ = 0x2a;
                          send_sni = ptls_buffer__do_pushv
                                               (ppStack_120,(void *)((long)&capacity_24 + 4),2);
                          if (send_sni != 0) goto LAB_0011718a;
                          body_start_24 = 2;
                          send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
                          if (send_sni != 0) goto LAB_0011718a;
                          body_size_24 = ppStack_120->off;
                          uStack_438 = ppStack_120->off - body_size_24;
                          if (body_start_24 == 0xffffffffffffffff) {
                            send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uStack_438);
                            if (send_sni != 0) goto LAB_0011718a;
                          }
                          else {
                            for (; body_start_24 != 0; body_start_24 = body_start_24 - 1) {
                              ppStack_120->base[body_size_24 - body_start_24] =
                                   (uint8_t)(uStack_438 >>
                                            (((char)body_start_24 + -1) * '\b' & 0x3fU));
                            }
                          }
                        }
                        send_sni = 0;
                        capacity_25._6_2_ = 0x29;
                        capacity_25._4_1_ = 0;
                        capacity_25._5_1_ = 0x29;
                        send_sni = ptls_buffer__do_pushv
                                             (ppStack_120,(void *)((long)&capacity_25 + 4),2);
                        if (send_sni != 0) goto LAB_0011718a;
                        body_start_25 = 2;
                        send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
                        if (send_sni != 0) goto LAB_0011718a;
                        capacity_26 = ppStack_120->off;
                        body_start_26 = 2;
                        send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
                        if (send_sni != 0) goto LAB_0011718a;
                        capacity_27 = ppStack_120->off;
                        body_start_27 = 2;
                        send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
                        if (send_sni != 0) goto LAB_0011718a;
                        body_size_27 = ppStack_120->off;
                        send_sni = ptls_buffer__do_pushv
                                             (ppStack_120,published_sni,
                                              (size_t)resumption_ticket.base);
                        if (send_sni != 0) goto LAB_0011718a;
                        uStack_478 = ppStack_120->off - body_size_27;
                        if (body_start_27 == 0xffffffffffffffff) {
                          send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uStack_478);
                          if (send_sni != 0) goto LAB_0011718a;
                        }
                        else {
                          for (; body_start_27 != 0; body_start_27 = body_start_27 - 1) {
                            ppStack_120->base[body_size_27 - body_start_27] =
                                 (uint8_t)(uStack_478 >> (((char)body_start_27 + -1) * '\b' & 0x3fU)
                                          );
                          }
                        }
                        send_sni = 0;
                        body_size_26._4_4_ = msghash_off._4_4_;
                        body_size_26._0_1_ = (undefined1)((uint)msghash_off._4_4_ >> 0x18);
                        body_size_26._1_1_ = (undefined1)((uint)msghash_off._4_4_ >> 0x10);
                        body_size_26._2_1_ = (undefined1)((uint)msghash_off._4_4_ >> 8);
                        body_size_26._3_1_ = (undefined1)msghash_off._4_4_;
                        send_sni = ptls_buffer__do_pushv(ppStack_120,&body_size_26,4);
                        if (send_sni != 0) goto LAB_0011718a;
                        uVar7 = ppStack_120->off - capacity_27;
                        if (body_start_26 == 0xffffffffffffffff) {
                          send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uVar7);
                          if (send_sni != 0) goto LAB_0011718a;
                        }
                        else {
                          for (; body_start_26 != 0; body_start_26 = body_start_26 - 1) {
                            ppStack_120->base[capacity_27 - body_start_26] =
                                 (uint8_t)(uVar7 >> (((char)body_start_26 + -1) * '\b' & 0x3fU));
                          }
                        }
                        send_sni = 0;
                        body_start_28 = 2;
                        send_sni = ptls_buffer__do_pushv(ppStack_120,"",2);
                        if (send_sni != 0) goto LAB_0011718a;
                        sVar1 = ppStack_120->off;
                        body_start_29 = 1;
                        send_sni = ptls_buffer__do_pushv(ppStack_120,"",1);
                        if (send_sni != 0) goto LAB_0011718a;
                        sVar2 = ppStack_120->off;
                        send_sni = ptls_buffer_reserve(ppStack_120,
                                                       (tls->key_schedule->hashes[0].algo)->
                                                       digest_size);
                        if (send_sni != 0) goto LAB_0011718a;
                        ppStack_120->off =
                             (tls->key_schedule->hashes[0].algo)->digest_size + ppStack_120->off;
                        sVar3 = ppStack_120->off;
                        for (; body_start_29 != 0; body_start_29 = body_start_29 - 1) {
                          ppStack_120->base[sVar2 - body_start_29] =
                               (uint8_t)(sVar3 - sVar2 >>
                                        (((char)body_start_29 + -1) * '\b' & 0x3fU));
                        }
                        sVar2 = ppStack_120->off;
                        for (; body_start_28 != 0; body_start_28 = body_start_28 - 1) {
                          ppStack_120->base[sVar1 - body_start_28] =
                               (uint8_t)(sVar2 - sVar1 >>
                                        (((char)body_start_28 + -1) * '\b' & 0x3fU));
                        }
                        uVar7 = ppStack_120->off - capacity_26;
                        if (body_start_25 == 0xffffffffffffffff) {
                          send_sni = ptls_buffer__adjust_quic_blocksize(ppStack_120,uVar7);
                          if (send_sni != 0) goto LAB_0011718a;
                        }
                        else {
                          for (; body_start_25 != 0; body_start_25 = body_start_25 - 1) {
                            ppStack_120->base[capacity_26 - body_start_25] =
                                 (uint8_t)(uVar7 >> (((char)body_start_25 + -1) * '\b' & 0x3fU));
                          }
                        }
                      }
                      send_sni = 0;
                      sVar1 = ppStack_120->off;
                      for (; body_start_4 != 0; body_start_4 = body_start_4 - 1) {
                        ppStack_120->base[key_share_client_hello.len - body_start_4] =
                             (uint8_t)(sVar1 - key_share_client_hello.len >>
                                      (((char)body_start_4 + -1) * '\b' & 0x3fU));
                      }
                      uVar7 = *(long *)_key_sched->secret - (long)sendbuf;
                      if (body_start == 0xffffffffffffffff) {
                        send_sni = ptls_buffer__adjust_quic_blocksize
                                             ((ptls_buffer_t *)_key_sched,uVar7);
                        if (send_sni != 0) goto LAB_0011718a;
                      }
                      else {
                        for (; body_start != 0; body_start = body_start - 1) {
                          *(char *)((long)sendbuf + (*(long *)_key_sched - body_start)) =
                               (char)(uVar7 >> (((char)body_start + -1) * '\b' & 0x3fU));
                        }
                      }
                      send_sni = 0;
                      if (mess_start != 0) {
                        ptls__key_schedule_update_hash
                                  ((ptls_key_schedule_t *)mess_start,
                                   (uint8_t *)(*(long *)_key_sched + local_100),
                                   *(long *)_key_sched->secret - local_100);
                      }
                      send_sni = (*(code *)_buf[1].base)(_buf);
                      if (send_sni == 0) {
                        local_60 = lVar6;
                        if (resumption_ticket.len != 0) {
                          local_60 = emitter->buf->off -
                                     ((tls->key_schedule->hashes[0].algo)->digest_size + 3);
                          send_sni = derive_secret_with_empty_digest
                                               (tls->key_schedule,&is_second_flight,"res binder");
                          if (send_sni != 0) goto LAB_0011718a;
                          ptls__key_schedule_update_hash
                                    (tls->key_schedule,emitter->buf->base + lVar6,local_60 - lVar6);
                          send_sni = calc_verify_data(emitter->buf->base + local_60 + 3,
                                                      tls->key_schedule,&is_second_flight);
                          if (send_sni != 0) goto LAB_0011718a;
                        }
                        send_sni = 0;
                        ptls__key_schedule_update_hash
                                  (tls->key_schedule,emitter->buf->base + local_60,
                                   emitter->buf->off - local_60);
                        if (((tls->field_18).server.pending_traffic_secret[0x38] >> 1 & 1) != 0) {
                          if (local_b0 != 0) {
                            __assert_fail("!is_second_flight",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                                          ,0x840,
                                          "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                                         );
                          }
                          send_sni = setup_traffic_protection(tls,1,"c e traffic",1,0);
                          if ((send_sni != 0) ||
                             (send_sni = push_change_cipher_spec(tls,emitter), send_sni != 0))
                          goto LAB_0011718a;
                          send_sni = 0;
                        }
                        if (((resumption_ticket.len == 0) || (local_b0 != 0)) ||
                           (send_sni = derive_exporter_secret(tls,1), send_sni == 0)) {
                          eVar9 = PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
                          if (cookie == (ptls_iovec_t *)0x0) {
                            eVar9 = PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
                          }
                          tls->state = eVar9;
                          send_sni = 0x202;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0011718a:
  if (pcStack_50 != (char *)0x0) {
    free(pcStack_50);
  }
  (*ptls_clear_memory)(&is_second_flight,0x40);
  return send_sni;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    ptls_iovec_t resumption_secret = {NULL}, resumption_ticket;
    char *published_sni = NULL;
    uint32_t obfuscated_ticket_age = 0;
    size_t msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret, is_second_flight = tls->key_schedule != NULL,
             send_sni = tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name);

    if (properties != NULL) {
        /* try to use ESNI */
        if (!is_second_flight && send_sni && properties->client.esni_keys.base != NULL) {
            if ((ret = client_setup_esni(tls->ctx, &tls->esni, properties->client.esni_keys, &published_sni, tls->client_random)) !=
                0) {
                goto Exit;
            }
            if (tls->ctx->update_esni_key != NULL) {
                if ((ret = tls->ctx->update_esni_key->cb(tls->ctx->update_esni_key, tls, tls->esni->secret,
                                                         tls->esni->client.cipher->hash, tls->esni->esni_contents_hash)) != 0)
                    goto Exit;
            }
        }
        /* setup resumption-related data. If successful, resumption_secret becomes a non-zero value. */
        if (properties->client.session_ticket.base != NULL) {
            ptls_key_exchange_algorithm_t *key_share = NULL;
            ptls_cipher_suite_t *cipher_suite = NULL;
            uint32_t max_early_data_size;
            if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &resumption_secret, &obfuscated_ticket_age,
                                             &resumption_ticket, &max_early_data_size, properties->client.session_ticket.base,
                                             properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
                tls->client.offered_psk = 1;
                /* key-share selected by HRR should not be overridden */
                if (tls->key_share == NULL)
                    tls->key_share = key_share;
                tls->cipher_suite = cipher_suite;
                if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                    tls->client.using_early_data = 1;
                    *properties->client.max_early_data_size = max_early_data_size;
                }
            } else {
                resumption_secret = ptls_iovec_init(NULL, 0);
            }
        }
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    if (!is_second_flight) {
        tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ctx->hkdf_label_prefix__obsolete);
        if ((ret = key_schedule_extract(tls->key_schedule, resumption_secret)) != 0)
            goto Exit;
    }

    msghash_off = emitter->buf->off + emitter->record_header_length;
    ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        ptls_buffer_t *sendbuf = emitter->buf;
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, tls->client_random, sizeof(tls->client_random));
        /* lecagy_session_id */
        ptls_buffer_push_block(
            sendbuf, 1, { ptls_buffer_pushv(sendbuf, tls->client.legacy_session_id.base, tls->client.legacy_session_id.len); });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = tls->ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            struct {
                size_t off;
                size_t len;
            } key_share_client_hello;
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                key_share_client_hello.off = sendbuf->off;
                ptls_buffer_push_block(sendbuf, 2, {
                    if (tls->key_share != NULL) {
                        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
                            goto Exit;
                        if ((ret = push_key_share_entry(sendbuf, tls->key_share->id, tls->client.key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    }
                });
                key_share_client_hello.len = sendbuf->off - key_share_client_hello.off;
            });
            if (send_sni) {
                if (tls->esni != NULL) {
                    if (published_sni != NULL) {
                        buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                            if ((ret = emit_server_name_extension(sendbuf, published_sni)) != 0)
                                goto Exit;
                        });
                    }
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME, {
                        if ((ret = emit_esni_extension(tls->esni, sendbuf, properties->client.esni_keys, tls->server_name,
                                                       key_share_client_hello.off, key_share_client_hello.len)) != 0)
                            goto Exit;
                    });
                } else {
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                        if ((ret = emit_server_name_extension(sendbuf, tls->server_name)) != 0)
                            goto Exit;
                    });
                }
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (tls->ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = tls->ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != PTLS_ELEMENTSOF(supported_versions); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(sendbuf)) != 0)
                    goto Exit;
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                ptls_key_exchange_algorithm_t **algo = tls->ctx->key_exchanges;
                ptls_buffer_push_block(sendbuf, 2, {
                    for (; *algo != NULL; ++algo)
                        ptls_buffer_push16(sendbuf, (*algo)->id);
                });
            });
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (tls->ctx->save_ticket != NULL || resumption_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!tls->ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (resumption_secret.base != NULL) {
                if (tls->client.using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2,
                                               { ptls_buffer_pushv(sendbuf, resumption_ticket.base, resumption_ticket.len); });
                        ptls_buffer_push32(sendbuf, obfuscated_ticket_age);
                    });
                    /* allocate space for PSK binder. the space is filled at the bottom of the function */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                                goto Exit;
                            sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
                        });
                    });
                });
            }
        });
    });

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (resumption_secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, "res binder")) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off);

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter)) != 0)
            goto Exit;
    }
    if (resumption_secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    if (published_sni != NULL) {
        free(published_sni);
    }
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}